

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sender.cc
# Opt level: O2

void receive_result(sender *s)

{
  ulong uVar1;
  example *ec;
  float extraout_XMM0_Da;
  float weight;
  float res;
  float local_20;
  float local_1c;
  
  get_prediction(s->sd,&local_1c,&local_20);
  uVar1 = s->received_index;
  s->received_index = uVar1 + 1;
  ec = s->delay_ring[uVar1 % s->all->p->ring_size];
  (ec->pred).scalar = local_1c;
  (*s->all->loss->_vptr_loss_function[1])(local_1c,(ec->l).simple.label);
  ec->loss = extraout_XMM0_Da * ec->weight;
  return_simple_example(s->all,(void *)0x0,ec);
  return;
}

Assistant:

void receive_result(sender& s)
{
  float res, weight;

  get_prediction(s.sd, res, weight);
  example& ec = *s.delay_ring[s.received_index++ % s.all->p->ring_size];
  ec.pred.scalar = res;

  label_data& ld = ec.l.simple;
  ec.loss = s.all->loss->getLoss(s.all->sd, ec.pred.scalar, ld.label) * ec.weight;

  return_simple_example(*(s.all), nullptr, ec);
}